

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *in_RDX;
  int *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  int end;
  int start;
  ImVec2 pos;
  ImRect unclipped_rect;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float fStack_5c;
  ImVec2 local_58;
  ImVec2 local_50;
  ImRect local_48;
  ImRect local_38;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  int *local_18;
  int *local_10;
  float local_8;
  int local_4;
  
  local_20 = GImGui;
  local_28 = GImGui->CurrentWindow;
  if ((GImGui->LogEnabled & 1U) == 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_XMM0_Da;
    local_4 = in_EDI;
    bVar1 = GetSkipItemForListClipping();
    if (bVar1) {
      *local_18 = 0;
      *local_10 = 0;
    }
    else {
      local_38.Min = (local_28->ClipRect).Min;
      local_38.Max = (local_28->ClipRect).Max;
      if ((local_20->NavMoveRequest & 1U) != 0) {
        ImRect::Add(&local_38,&local_20->NavScoringRect);
      }
      if ((local_20->NavJustMovedToId != 0) &&
         (local_28->NavLastIds[0] == local_20->NavJustMovedToId)) {
        local_50 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               (ImVec2 *)0x2f00e3);
        local_58 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               (ImVec2 *)0x2f0101);
        ImRect::ImRect(&local_48,&local_50,&local_58);
        ImRect::Add(&local_38,&local_48);
      }
      fStack_5c = (local_28->DC).CursorPos.y;
      iVar2 = (int)((local_38.Min.y - fStack_5c) / local_8);
      iVar3 = (int)((local_38.Max.y - fStack_5c) / local_8);
      if (((local_20->NavMoveRequest & 1U) != 0) && (local_20->NavMoveClipDir == 2)) {
        iVar2 = iVar2 + -1;
      }
      if (((local_20->NavMoveRequest & 1U) != 0) && (local_20->NavMoveClipDir == 3)) {
        iVar3 = iVar3 + 1;
      }
      iVar2 = ImClamp<int>(iVar2,0,local_4);
      iVar3 = ImClamp<int>(iVar3 + 1,iVar2,local_4);
      *local_10 = iVar2;
      *local_18 = iVar3;
    }
  }
  else {
    *in_RSI = 0;
    *in_RDX = in_EDI;
  }
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max));

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}